

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

int Cec_ManSimCompareEqualFirstBit(uint *p0,uint *p1,int nWords)

{
  int i;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (((*p1 ^ *p0) & 1) == 0) {
    if (0 < nWords) {
      iVar2 = 0;
      uVar3 = 0;
      do {
        if (p0[uVar3] != p1[uVar3]) {
          uVar1 = 0;
          goto LAB_005ca355;
        }
        uVar3 = uVar3 + 1;
        iVar2 = iVar2 + -0x20;
      } while ((uint)nWords != uVar3);
    }
  }
  else if (0 < nWords) {
    iVar2 = 0;
    uVar3 = 0;
    do {
      if (p0[uVar3] != ~p1[uVar3]) {
        uVar1 = 0;
        goto LAB_005ca369;
      }
      uVar3 = uVar3 + 1;
      iVar2 = iVar2 + -0x20;
    } while ((uint)nWords != uVar3);
  }
  return -1;
  while (uVar1 = uVar1 + 1, uVar1 != 0x20) {
LAB_005ca369:
    if (((p0[uVar3] ^ ~p1[uVar3]) >> (uVar1 & 0x1f) & 1) != 0) goto LAB_005ca37b;
  }
  goto LAB_005ca376;
  while (uVar1 = uVar1 + 1, uVar1 != 0x20) {
LAB_005ca355:
    if (((p1[uVar3] ^ p0[uVar3]) >> (uVar1 & 0x1f) & 1) != 0) goto LAB_005ca37b;
  }
LAB_005ca376:
  uVar1 = 0xffffffff;
LAB_005ca37b:
  return uVar1 - iVar2;
}

Assistant:

int Cec_ManSimCompareEqualFirstBit( unsigned * p0, unsigned * p1, int nWords )
{
    int w;
    if ( (p0[0] & 1) == (p1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                return 32*w + Gia_WordFindFirstBit( p0[w] ^ p1[w] );
        return -1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                return 32*w + Gia_WordFindFirstBit( p0[w] ^ ~p1[w] );
        return -1;
    }
}